

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_option_conflict(nn_parse_context *ctx,int opt_index)

{
  ulong uVar1;
  nn_option *opt;
  int num_conflicts;
  int i;
  unsigned_long mask;
  int opt_index_local;
  nn_parse_context *ctx_local;
  
  fprintf(_stderr,"%s: Option",*ctx->argv);
  nn_print_option(ctx,opt_index,(FILE *)_stderr);
  fprintf(_stderr,"conflicts with the following options:\n");
  uVar1 = ctx->options[opt_index].conflicts_mask;
  opt._0_4_ = 0;
  opt._4_4_ = 0;
  while (ctx->options[opt._4_4_].longname != (char *)0x0) {
    if (((opt._4_4_ != opt_index) && (ctx->last_option_usage[opt._4_4_] != (char *)0x0)) &&
       ((ctx->options[opt._4_4_].mask_set & uVar1) != 0)) {
      opt._0_4_ = (int)opt + 1;
      fprintf(_stderr,"   ");
      nn_print_option(ctx,opt._4_4_,(FILE *)_stderr);
      fprintf(_stderr,"\n");
    }
    opt._4_4_ = opt._4_4_ + 1;
  }
  if ((int)opt == 0) {
    fprintf(_stderr,"   ");
    nn_print_option(ctx,opt_index,(FILE *)_stderr);
    fprintf(_stderr,"\n");
  }
  exit(1);
}

Assistant:

static void nn_option_conflict (struct nn_parse_context *ctx,
                              int opt_index)
{
    unsigned long mask;
    int i;
    int num_conflicts;
    struct nn_option *opt;

    fprintf (stderr, "%s: Option", ctx->argv[0]);
    nn_print_option (ctx, opt_index, stderr);
    fprintf (stderr, "conflicts with the following options:\n");

    mask = ctx->options[opt_index].conflicts_mask;
    num_conflicts = 0;
    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (i == opt_index)
            continue;
        if (ctx->last_option_usage[i] && opt->mask_set & mask) {
            num_conflicts += 1;
            fprintf (stderr, "   ");
            nn_print_option (ctx, i, stderr);
            fprintf (stderr, "\n");
        }
    }
    if (!num_conflicts) {
        fprintf (stderr, "   ");
        nn_print_option (ctx, opt_index, stderr);
        fprintf (stderr, "\n");
    }
    exit (1);
}